

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::WarningsAsErrorsTest(void)

{
  bool bVar1;
  undefined1 local_1538 [8];
  Parser parser_1;
  IDLOptions opts_1;
  undefined1 local_a98 [8];
  Parser parser;
  IDLOptions opts;
  
  IDLOptions::IDLOptions((IDLOptions *)&parser.anonymous_counter_);
  Parser::Parser((Parser *)local_a98,(IDLOptions *)&parser.anonymous_counter_);
  bVar1 = Parser::Parse((Parser *)local_a98,
                        "table T { THIS_NAME_CAUSES_A_WARNING:string;}\nroot_type T;",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(\"table T { THIS_NAME_CAUSES_A_WARNING:string;}\\n\" \"root_type T;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x36c,"");
  Parser::~Parser((Parser *)local_a98);
  IDLOptions::~IDLOptions((IDLOptions *)&parser.anonymous_counter_);
  IDLOptions::IDLOptions((IDLOptions *)&parser_1.anonymous_counter_);
  Parser::Parser((Parser *)local_1538,(IDLOptions *)&parser_1.anonymous_counter_);
  bVar1 = Parser::Parse((Parser *)local_1538,
                        "table T { THIS_NAME_CAUSES_A_WARNING:string;}\nroot_type T;",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(bVar1,false,
                    "\'parser.Parse(\"table T { THIS_NAME_CAUSES_A_WARNING:string;}\\n\" \"root_type T;\")\' != \'false\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x374,"");
  Parser::~Parser((Parser *)local_1538);
  IDLOptions::~IDLOptions((IDLOptions *)&parser_1.anonymous_counter_);
  return;
}

Assistant:

void WarningsAsErrorsTest() {
  {
    flatbuffers::IDLOptions opts;
    // opts.warnings_as_errors should default to false
    flatbuffers::Parser parser(opts);
    TEST_EQ(parser.Parse("table T { THIS_NAME_CAUSES_A_WARNING:string;}\n"
                         "root_type T;"),
            true);
  }
  {
    flatbuffers::IDLOptions opts;
    opts.warnings_as_errors = true;
    flatbuffers::Parser parser(opts);
    TEST_EQ(parser.Parse("table T { THIS_NAME_CAUSES_A_WARNING:string;}\n"
                         "root_type T;"),
            false);
  }
}